

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O2

void __thiscall Centaurus::NFA<unsigned_char>::parse(NFA<unsigned_char> *this,Stream *stream)

{
  wchar_t ch;
  NFA<unsigned_char> nfa;
  NFABase<Centaurus::NFABaseState<unsigned_char,_int>_> NStack_48;
  
  ch = Stream::get(stream);
  while ((0x2f < (uint)ch || ((0x820000000001U >> ((ulong)(uint)ch & 0x3f) & 1) == 0))) {
    NFA((NFA<unsigned_char> *)&NStack_48);
    parse_selection((NFA<unsigned_char> *)&NStack_48,stream,ch);
    concat(this,(NFA<unsigned_char> *)&NStack_48);
    NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>::~NFABase(&NStack_48);
    ch = Stream::get(stream);
  }
  return;
}

Assistant:

void parse(Stream& stream)
    {
        for (wchar_t ch = stream.get(); ch != L')' && ch != L'/' && ch != L'\0'; ch = stream.get())
        {
            NFA<TCHAR> nfa;
            nfa.parse_selection(stream, ch);
            concat(nfa);
        }
    }